

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_n_base.h
# Opt level: O3

string * __thiscall
test_uintwide_t_n_base::
hexlexical_cast<math::wide_integer::uintwide_t<8192u,unsigned_int,void,false>>
          (string *__return_storage_ptr__,test_uintwide_t_n_base *this,
          uintwide_t<24U,_unsigned_char,_void,_false> *u)

{
  stringstream ss;
  stringstream asStack_198 [16];
  long local_188 [3];
  uint auStack_170 [22];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  *(uint *)((long)auStack_170 + *(long *)(local_188[0] + -0x18)) =
       *(uint *)((long)auStack_170 + *(long *)(local_188[0] + -0x18)) & 0xffffffb5 | 8;
  math::wide_integer::operator<<
            ((basic_ostream<char,_std::char_traits<char>_> *)local_188,
             (uintwide_t<24U,_unsigned_char,_void,_false> *)this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

static auto hexlexical_cast(const UnsignedIntegralType& u) -> std::string
    {
      std::stringstream ss;

      ss << std::hex << u;

      return ss.str();
    }